

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11CachePolicy.cpp
# Opt level: O1

void __thiscall GmmLib::GmmGen11CachePolicy::SetUpMOCSTable(GmmGen11CachePolicy *this)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined2 uVar13;
  undefined2 uVar14;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined2 uVar17;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined2 uVar20;
  undefined2 uVar21;
  undefined2 uVar22;
  undefined2 uVar23;
  undefined2 uVar24;
  Context *pCVar25;
  int index;
  long lVar26;
  ushort uVar27;
  ushort uVar28;
  uint uVar29;
  uint uVar30;
  
  pCVar25 = (this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
            super_GmmCachePolicyCommon.pGmmLibContext;
  lVar26 = 0;
  do {
    uVar1 = pCVar25->CachePolicyTbl[lVar26].L3;
    pCVar25->CachePolicyTbl[lVar26].L3.UshortValue = uVar1 & 0xffc0 | 0x30;
    pCVar25->CachePolicyTbl[lVar26].LeCC.DwordValue =
         pCVar25->CachePolicyTbl[lVar26].LeCC.DwordValue & 0xfff80000 | 0x37;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x40);
  uVar2 = pCVar25->CachePolicyTbl[1].L3;
  uVar3 = pCVar25->CachePolicyTbl[2].L3;
  pCVar25->CachePolicyTbl[1].L3.UshortValue = uVar2 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[1].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[1].LeCC.DwordValue & 0xfff80000 | 4;
  pCVar25->CachePolicyTbl[2].L3.UshortValue = uVar3 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[2].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[2].LeCC.DwordValue & 0xfff80000 | 0x37;
  uVar4 = pCVar25->CachePolicyTbl[3].L3;
  pCVar25->CachePolicyTbl[3].L3.UshortValue = uVar4 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[3].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[3].LeCC.DwordValue & 0xfff80000 | 5;
  uVar5 = pCVar25->CachePolicyTbl[4].L3;
  pCVar25->CachePolicyTbl[4].L3.UshortValue = uVar5 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[4].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[4].LeCC.DwordValue & 0xfff80000 | 5;
  uVar6 = pCVar25->CachePolicyTbl[5].L3;
  pCVar25->CachePolicyTbl[5].L3.UshortValue = uVar6 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[5].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[5].LeCC.DwordValue & 0xfff80000 | 0x37;
  uVar7 = pCVar25->CachePolicyTbl[6].L3;
  pCVar25->CachePolicyTbl[6].L3.UshortValue = uVar7 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[6].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[6].LeCC.DwordValue & 0xfff80000 | 0x17;
  uVar8 = pCVar25->CachePolicyTbl[7].L3;
  pCVar25->CachePolicyTbl[7].L3.UshortValue = uVar8 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[7].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[7].LeCC.DwordValue & 0xfff80000 | 0x17;
  uVar9 = pCVar25->CachePolicyTbl[8].L3;
  pCVar25->CachePolicyTbl[8].L3.UshortValue = uVar9 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[8].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[8].LeCC.DwordValue & 0xfff80000 | 0x27;
  uVar10 = pCVar25->CachePolicyTbl[9].L3;
  pCVar25->CachePolicyTbl[9].L3.UshortValue = uVar10 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[9].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[9].LeCC.DwordValue & 0xfff80000 | 0x27;
  uVar11 = pCVar25->CachePolicyTbl[10].L3;
  pCVar25->CachePolicyTbl[10].L3.UshortValue = uVar11 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[10].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[10].LeCC.DwordValue & 0xfff80000 | 0x77;
  uVar12 = pCVar25->CachePolicyTbl[0xb].L3;
  pCVar25->CachePolicyTbl[0xb].L3.UshortValue = uVar12 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0xb].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0xb].LeCC.DwordValue & 0xfff80000 | 0x77;
  uVar13 = pCVar25->CachePolicyTbl[0xc].L3;
  pCVar25->CachePolicyTbl[0xc].L3.UshortValue = uVar13 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[0xc].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0xc].LeCC.DwordValue & 0xfff80000 | 0x57;
  uVar14 = pCVar25->CachePolicyTbl[0xd].L3;
  pCVar25->CachePolicyTbl[0xd].L3.UshortValue = uVar14 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0xd].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0xd].LeCC.DwordValue & 0xfff80000 | 0x57;
  uVar15 = pCVar25->CachePolicyTbl[0xe].L3;
  pCVar25->CachePolicyTbl[0xe].L3.UshortValue = uVar15 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[0xe].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0xe].LeCC.DwordValue & 0xfff80000 | 0x67;
  uVar16 = pCVar25->CachePolicyTbl[0xf].L3;
  pCVar25->CachePolicyTbl[0xf].L3.UshortValue = uVar16 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0xf].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0xf].LeCC.DwordValue & 0xfff80000 | 0x67;
  uVar27 = pCVar25->CachePolicyTbl[0x10].L3.UshortValue & 0xffc0;
  pCVar25->CachePolicyTbl[0x10].L3.UshortValue = uVar27;
  uVar29 = pCVar25->CachePolicyTbl[0x10].LeCC.DwordValue & 0xfff80000;
  pCVar25->CachePolicyTbl[0x10].LeCC.DwordValue = uVar29;
  uVar28 = pCVar25->CachePolicyTbl[0x11].L3.UshortValue & 0xffc0;
  pCVar25->CachePolicyTbl[0x11].L3.UshortValue = uVar28;
  uVar30 = pCVar25->CachePolicyTbl[0x11].LeCC.DwordValue & 0xfff80000;
  pCVar25->CachePolicyTbl[0x11].LeCC.DwordValue = uVar30;
  uVar17 = pCVar25->CachePolicyTbl[0x12].L3;
  pCVar25->CachePolicyTbl[0x12].L3.UshortValue = uVar17 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x12].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x12].LeCC.DwordValue & 0xfff80000 | 0x60037;
  uVar18 = pCVar25->CachePolicyTbl[0x13].L3;
  pCVar25->CachePolicyTbl[0x13].L3.UshortValue = uVar18 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x13].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x13].LeCC.DwordValue & 0xfff80000 | 0x737;
  uVar19 = pCVar25->CachePolicyTbl[0x14].L3;
  pCVar25->CachePolicyTbl[0x14].L3.UshortValue = uVar19 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x14].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x14].LeCC.DwordValue & 0xfff80000 | 0x337;
  uVar20 = pCVar25->CachePolicyTbl[0x15].L3;
  pCVar25->CachePolicyTbl[0x15].L3.UshortValue = uVar20 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x15].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x15].LeCC.DwordValue & 0xfff80000 | 0x137;
  uVar21 = pCVar25->CachePolicyTbl[0x16].L3;
  pCVar25->CachePolicyTbl[0x16].L3.UshortValue = uVar21 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x16].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x16].LeCC.DwordValue & 0xfff80000 | 0x3b7;
  uVar22 = pCVar25->CachePolicyTbl[0x17].L3;
  pCVar25->CachePolicyTbl[0x17].L3.UshortValue = uVar22 & 0xffc0 | 0x30;
  pCVar25->CachePolicyTbl[0x17].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x17].LeCC.DwordValue & 0xfff80000 | 0x7b7;
  uVar23 = pCVar25->CachePolicyTbl[0x3e].L3;
  pCVar25->CachePolicyTbl[0x3e].L3.UshortValue = uVar23 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[0x3e].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x3e].LeCC.DwordValue & 0xfff80000 | 0x37;
  uVar24 = pCVar25->CachePolicyTbl[0x3f].L3;
  pCVar25->CachePolicyTbl[0x3f].L3.UshortValue = uVar24 & 0xffc0 | 0x10;
  pCVar25->CachePolicyTbl[0x3f].LeCC.DwordValue =
       pCVar25->CachePolicyTbl[0x3f].LeCC.DwordValue & 0xfff80000 | 0x37;
  if (((((this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
         super_GmmCachePolicyCommon.pGmmLibContext)->SkuTable).field_1.field_0x1 & 4) != 0) {
    pCVar25->CachePolicyTbl[0x10].L3.UshortValue = uVar27 | 0x10;
    pCVar25->CachePolicyTbl[0x10].LeCC.DwordValue = uVar29 | 0x4005;
    pCVar25->CachePolicyTbl[0x11].L3.UshortValue = uVar28 | 0x30;
    pCVar25->CachePolicyTbl[0x11].LeCC.DwordValue = uVar30 | 0x4005;
  }
  (this->super_GmmGen10CachePolicy).super_GmmGen9CachePolicy.CurrentMaxMocsIndex = 0x17;
  return;
}

Assistant:

void GmmLib::GmmGen11CachePolicy::SetUpMOCSTable()
{
    GMM_CACHE_POLICY_TBL_ELEMENT *pCachePolicyTlbElement = &(pGmmLibContext->GetCachePolicyTlbElement()[0]);

#define GMM_DEFINE_MOCS(Index, L3_ESC, L3_SCC, L3_CC, LeCC_CC, LeCC_TC, LeCC_LRUM, LeCC_AOM, LeCC_ESC, LeCC_SCC, LeCC_PFM, LeCC_SCF, LeCC_CoS, LeCC_SelfSnoop) \
    {                                                                                                                                                          \
        pCachePolicyTlbElement[Index].L3.ESC            = L3_ESC;                                                                                              \
        pCachePolicyTlbElement[Index].L3.SCC            = L3_SCC;                                                                                              \
        pCachePolicyTlbElement[Index].L3.Cacheability   = L3_CC;                                                                                               \
        pCachePolicyTlbElement[Index].LeCC.Cacheability = LeCC_CC;                                                                                             \
        pCachePolicyTlbElement[Index].LeCC.TargetCache  = LeCC_TC;                                                                                             \
        pCachePolicyTlbElement[Index].LeCC.LRUM         = LeCC_LRUM;                                                                                           \
        pCachePolicyTlbElement[Index].LeCC.AOM          = LeCC_AOM;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.ESC          = LeCC_ESC;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SCC          = LeCC_SCC;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.PFM          = LeCC_PFM;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SCF          = LeCC_SCF;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.CoS          = LeCC_CoS;                                                                                            \
        pCachePolicyTlbElement[Index].LeCC.SelfSnoop    = LeCC_SelfSnoop;                                                                                      \
    }

    // clang-format off

    //Default MOCS Table
    for(int index = 0; index < GMM_MAX_NUMBER_MOCS_INDEXES; index++)
    {  //              Index     ESC    SCC      L3CC    LeCC    TC      LRUM    DAoM    ERSC    SCC     PFM     SCF     CoS     SSE
        GMM_DEFINE_MOCS(index   , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    }
    // Explicit MOCS Table
    //              Index     ESC	  SCC	  L3CC    LeCC    TC      LRUM    DAoM	  ERSC	  SCC	  PFM	  SCF     CoS     SSE
    GMM_DEFINE_MOCS( 1      , 0     , 0     , 3     , 0     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 2      , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 3      , 0     , 0     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 4      , 0     , 0     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 5      , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 6      , 0     , 0     , 1     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 7      , 0     , 0     , 3     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 8      , 0     , 0     , 1     , 3     , 1     , 2     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 9      , 0     , 0     , 3     , 3     , 1     , 2     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 10     , 0     , 0     , 1     , 3     , 1     , 3     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 11     , 0     , 0     , 3     , 3     , 1     , 3     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 12     , 0     , 0     , 1     , 3     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 13     , 0     , 0     , 3     , 3     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 14     , 0     , 0     , 1     , 3     , 1     , 2     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 15     , 0     , 0     , 3     , 3     , 1     , 2     , 1     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 16     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 17     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 18     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 3 )
    GMM_DEFINE_MOCS( 19     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 7     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 20     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 3     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 21     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 0     , 1     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 22     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 1     , 3     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 23     , 0     , 0     , 3     , 3     , 1     , 3     , 0     , 1     , 7     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 62     , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )
    GMM_DEFINE_MOCS( 63     , 0     , 0     , 1     , 3     , 1     , 3     , 0     , 0     , 0     , 0     , 0     , 0     , 0 )

    if(pGmmLibContext->GetSkuTable().FtrLLCBypass)
    {
        GMM_DEFINE_MOCS( 16     , 0     , 0     , 1     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 1     , 0     , 0 )
        GMM_DEFINE_MOCS( 17     , 0     , 0     , 3     , 1     , 1     , 0     , 0     , 0     , 0     , 0     , 1     , 0     , 0 )
    }

    CurrentMaxMocsIndex         = 23;

// clang-format on
#undef GMM_DEFINE_MOCS
}